

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid_test.c
# Opt level: O3

bool_t oidTest(void)

{
  int iVar1;
  bool_t bVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  octet buf [1024];
  char str [2048];
  char str1 [2048];
  octet aoStack_1418 [1024];
  char local_1018 [2048];
  char local_818 [2048];
  
  hexTo(aoStack_1418,"060000");
  uVar5 = 0;
  sVar3 = oidFromDER((char *)0x0,aoStack_1418,3);
  if (sVar3 == 0xffffffffffffffff) {
    hexTo(aoStack_1418,"068000");
    uVar5 = 0;
    sVar3 = oidFromDER((char *)0x0,aoStack_1418,3);
    if (sVar3 == 0xffffffffffffffff) {
      hexTo(aoStack_1418,"06FF00");
      uVar5 = 0;
      sVar3 = oidFromDER((char *)0x0,aoStack_1418,3);
      if (sVar3 == 0xffffffffffffffff) {
        hexTo(aoStack_1418,"080100");
        uVar5 = 0;
        sVar3 = oidFromDER((char *)0x0,aoStack_1418,3);
        if (sVar3 == 0xffffffffffffffff) {
          hexTo(aoStack_1418,"06070180808080807F");
          uVar5 = 0;
          sVar3 = oidFromDER((char *)0x0,aoStack_1418,9);
          if (sVar3 == 0xffffffffffffffff) {
            hexTo(aoStack_1418,"06028001");
            uVar5 = 0;
            sVar3 = oidFromDER((char *)0x0,aoStack_1418,4);
            if (sVar3 == 0xffffffffffffffff) {
              hexTo(aoStack_1418,"0602807F");
              uVar5 = 0;
              sVar3 = oidFromDER((char *)0x0,aoStack_1418,4);
              if (sVar3 == 0xffffffffffffffff) {
                hexTo(aoStack_1418,"06028100");
                sVar3 = oidFromDER(local_1018,aoStack_1418,4);
                if (sVar3 != 0xffffffffffffffff) {
                  iVar1 = strCmp(local_1018,"2.48");
                  if (iVar1 == 0) {
                    hexTo(aoStack_1418,"06028101");
                    sVar3 = oidFromDER(local_1018,aoStack_1418,4);
                    if (sVar3 != 0xffffffffffffffff) {
                      iVar1 = strCmp(local_1018,"2.49");
                      if (iVar1 == 0) {
                        hexTo(aoStack_1418,"06028837");
                        sVar3 = oidFromDER(local_1018,aoStack_1418,4);
                        if (sVar3 != 0xffffffffffffffff) {
                          iVar1 = strCmp(local_1018,"2.999");
                          if (iVar1 == 0) {
                            sVar3 = oidToDER(aoStack_1418,"2.65500");
                            if (sVar3 != 0xffffffffffffffff) {
                              sVar3 = oidFromDER(local_1018,aoStack_1418,sVar3);
                              if (sVar3 != 0xffffffffffffffff) {
                                iVar1 = strCmp(local_1018,"2.65500");
                                if (iVar1 == 0) {
                                  hexTo(aoStack_1418,"060981B1D1AF85ECA8804F");
                                  uVar5 = 0;
                                  sVar3 = oidFromDER((char *)0x0,aoStack_1418,0xb);
                                  if (sVar3 == 0xffffffffffffffff) {
                                    bVar2 = oidIsValid("2.5.4.4294967299");
                                    if (bVar2 == 0) {
                                      sVar3 = oidToDER(aoStack_1418,"1.2.112.0.2.0.34.101.31.81");
                                      if (sVar3 == 0xb) {
                                        bVar2 = hexEq(aoStack_1418,"06092A7000020022651F51");
                                        if (bVar2 != 0) {
                                          sVar3 = oidFromDER(local_1018,aoStack_1418,10);
                                          if (sVar3 == 0xffffffffffffffff) {
                                            uVar5 = 0;
                                            sVar3 = oidFromDER((char *)0x0,aoStack_1418,0xc);
                                            if (sVar3 == 0xffffffffffffffff) {
                                              strCopy(local_818,
                                                                                                            
                                                  "1.2.3456.78910.11121314.15161718.19202122.23242526.27282930.31323334.35363738.1.2.3.4.5.6.7.8.9.10.11.12.13.14.15.16.17.18.19.20.21.22.23.24.25.26.27.28.29.30.31.32.33.34.35.36.37.38.39.40.41.42.43.44.45.46.47.48.49.50.51.52.53.54.55.56.57.58.59.60.61.62.63.64.65.66.19.20.21.22.23.24.25.26.27.28.29.30.31.32.33.34.35.36.37.38.39.40.41.42.43.44.45.46.47.48.49.50.51.52.53.54.55.56.57.58.59.60.61.62.63.64.65.66.19.20.21.22.23.24.25.26.27.28.29.30.31.32.33.34.35.36.37.38.39.40.41.42.43.44.45.46.47.48.49.50.51.52.53.54.55.56.57.58.59.60.61.62.63.64.65.66"
                                                  );
                                              sVar3 = oidToDER(aoStack_1418,local_818);
                                              if (sVar3 != 0xffffffffffffffff) {
                                                sVar3 = oidFromDER(local_1018,aoStack_1418,sVar3);
                                                sVar4 = strLen(local_818);
                                                if (sVar3 == sVar4) {
                                                  iVar1 = strCmp(local_1018,local_818);
                                                  if (iVar1 == 0) {
                                                    sVar3 = strLen(local_818);
                                                    local_818[sVar3] = '.';
                                                    sVar3 = strLen(local_1018);
                                                    strCopy(local_818 + sVar3 + 1,local_1018);
                                                    sVar3 = oidToDER(aoStack_1418,local_818);
                                                    if (sVar3 != 0xffffffffffffffff) {
                                                      sVar3 = oidFromDER(local_1018,aoStack_1418,
                                                                         sVar3);
                                                      sVar4 = strLen(local_818);
                                                      if (sVar3 == sVar4) {
                                                        iVar1 = strCmp(local_1018,local_818);
                                                        uVar5 = (uint)(iVar1 == 0);
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

bool_t oidTest()
{
	octet buf[1024];
	char str[2048];
	char str1[2048];
	size_t count;
	// length octet 0x00
	hexTo(buf, "060000");
	if (oidFromDER(0, buf, 3) != SIZE_MAX)
		return FALSE;
	// length octet 0x80
	hexTo(buf, "068000");
	if (oidFromDER(0, buf, 3) != SIZE_MAX)
		return FALSE;
	// length octet 0xFF
	hexTo(buf, "06FF00");
	if (oidFromDER(0, buf, 3) != SIZE_MAX)
		return FALSE;
	// invalid type
	hexTo(buf, "080100");
	if (oidFromDER(0, buf, 3) != SIZE_MAX)
		return FALSE;
	// illegal padding
	hexTo(buf, "06070180808080807F");
	if (oidFromDER(0, buf, 9) != SIZE_MAX)
		return FALSE;
	hexTo(buf, "06028001");
	if (oidFromDER(0, buf, 4) != SIZE_MAX)
		return FALSE;
	hexTo(buf, "0602807F");
	if (oidFromDER(0, buf, 4) != SIZE_MAX)
		return FALSE;
	// MacOS errors
	hexTo(buf, "06028100");
	if (oidFromDER(str, buf, 4) == SIZE_MAX || !strEq(str, "2.48"))
		return FALSE;
	hexTo(buf, "06028101");
	if (oidFromDER(str, buf, 4) == SIZE_MAX || !strEq(str, "2.49"))
		return FALSE;
	hexTo(buf, "06028837");
	if (oidFromDER(str, buf, 4) == SIZE_MAX || !strEq(str, "2.999"))
		return FALSE;
	// OpenSSL errors
	count = oidToDER(buf, "2.65500");
	if (count == SIZE_MAX || oidFromDER(str, buf, count) == SIZE_MAX ||
		!strEq(str, "2.65500"))
		return FALSE;
	// overflow
	hexTo(buf, "060981B1D1AF85ECA8804F");
	if (oidFromDER(0, buf, 11) != SIZE_MAX)
		return FALSE;
	if (oidIsValid("2.5.4.4294967299"))
		return FALSE;
	// belt-hash
	count = oidToDER(buf, "1.2.112.0.2.0.34.101.31.81");
	if (count != 11 || !hexEq(buf, "06092A7000020022651F51"))
		return FALSE;
	if (oidFromDER(str, buf, count - 1) != SIZE_MAX)
		return FALSE;
	if (oidFromDER(0, buf, count + 1) != SIZE_MAX)
		return FALSE;
	// длинная длина
	strCopy(str1, "1.2.3456.78910.11121314.15161718.19202122.23242526."
		"27282930.31323334.35363738.1.2.3.4.5.6.7.8.9.10.11.12.13.14.15.16.17.18."
		"19.20.21.22.23.24.25.26.27.28.29.30.31.32.33.34.35.36.37.38.39.40.41.42."
		"43.44.45.46.47.48.49.50.51.52.53.54.55.56.57.58.59.60.61.62.63.64.65.66."
		"19.20.21.22.23.24.25.26.27.28.29.30.31.32.33.34.35.36.37.38.39.40.41.42."
		"43.44.45.46.47.48.49.50.51.52.53.54.55.56.57.58.59.60.61.62.63.64.65.66."
		"19.20.21.22.23.24.25.26.27.28.29.30.31.32.33.34.35.36.37.38.39.40.41.42."
		"43.44.45.46.47.48.49.50.51.52.53.54.55.56.57.58.59.60.61.62.63.64.65.66");
	count = oidToDER(buf, str1);
	if (count == SIZE_MAX ||
		oidFromDER(str, buf, count) != strLen(str1) ||
		!strEq(str, str1))
		return FALSE;
	str1[strLen(str1)] = '.';
	strCopy(str1 + strLen(str) + 1, str);
	count = oidToDER(buf, str1);
	if (count == SIZE_MAX ||
		oidFromDER(str, buf, count) != strLen(str1) ||
		!strEq(str, str1))
		return FALSE;
	// все нормально
	return TRUE;
}